

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void check_morale(tgestate_t *state)

{
  tgestate_t *in_RDI;
  
  if (in_RDI->morale < 2) {
    queue_message(in_RDI,message_MORALE_IS_ZERO);
    in_RDI->morale_exhausted = 0xff;
    in_RDI->automatic_player_counter = '\0';
  }
  return;
}

Assistant:

void check_morale(tgestate_t *state)
{
  assert(state != NULL);

  if (state->morale >= 2)
    return;

  queue_message(state, message_MORALE_IS_ZERO);

  /* Inhibit user input. */
  state->morale_exhausted = 255;

  /* Immediately assume automatic control of hero. */
  state->automatic_player_counter = 0;
}